

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cameras.cpp
# Opt level: O0

optional<pbrt::CameraWiSample> * __thiscall
pbrt::PerspectiveCamera::SampleWi
          (PerspectiveCamera *this,Interaction *ref,Point2f u,SampledWavelengths *lambda)

{
  Tuple2<pbrt::Point2,_float> t;
  Point3<float> p;
  Vector3<float> v;
  Normal3f n_00;
  Point2f pRaster_00;
  Point2f u_00;
  Vector3<float> v_00;
  Point3f p_00;
  Normal3<float> n_01;
  bool bVar1;
  long in_RDX;
  long in_RSI;
  optional<pbrt::CameraWiSample> *in_RDI;
  float fVar2;
  type tVar3;
  undefined1 in_ZMM0 [64];
  undefined1 auVar4 [64];
  undefined1 auVar5 [64];
  undefined1 auVar13 [56];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  float fVar14;
  undefined1 auVar15 [64];
  Point3f PVar17;
  Vector3f VVar18;
  Vector3<float> VVar19;
  SampledSpectrum SVar20;
  SampledSpectrum Wi;
  Point2f pRaster;
  Float pdf;
  Float lensArea;
  Float dist;
  Vector3f wi;
  Interaction lensIntr;
  Normal3f n;
  Point3f pLensRender;
  Point2f pLens;
  float in_stack_fffffffffffffbd8;
  float in_stack_fffffffffffffbdc;
  undefined4 in_stack_fffffffffffffbe0;
  undefined4 in_stack_fffffffffffffbe4;
  undefined4 in_stack_fffffffffffffbe8;
  Float in_stack_fffffffffffffbec;
  undefined4 in_stack_fffffffffffffbf0;
  float in_stack_fffffffffffffbf4;
  undefined1 *puVar21;
  undefined4 in_stack_fffffffffffffbf8;
  float fVar22;
  float fVar23;
  Float time;
  float in_stack_fffffffffffffc10;
  float fVar24;
  float in_stack_fffffffffffffc18;
  float in_stack_fffffffffffffc1c;
  Interaction *pIVar25;
  undefined8 in_stack_fffffffffffffc28;
  undefined4 uStack_3cc;
  undefined8 in_stack_fffffffffffffc38;
  float in_stack_fffffffffffffc40;
  Interaction *in_stack_fffffffffffffc88;
  Tuple3<pbrt::Vector3,_float> in_stack_fffffffffffffca0;
  Point2f *pRasterOut;
  undefined4 in_stack_fffffffffffffd34;
  Interval in_stack_fffffffffffffd38;
  Interval in_stack_fffffffffffffd40;
  undefined1 local_258 [8];
  undefined8 local_250;
  float local_248;
  undefined8 local_240;
  undefined4 local_238;
  undefined8 local_230;
  float local_228;
  undefined8 local_220;
  undefined4 local_218;
  float local_210;
  float local_20c;
  undefined8 local_208;
  float local_200;
  undefined8 local_1f8;
  float local_1f0;
  type local_1ec;
  undefined8 local_1e8;
  float local_1e0;
  undefined8 local_1d8;
  float local_1d0;
  undefined8 local_1c8;
  float local_1c0;
  undefined8 local_1b8;
  float local_1b0;
  undefined8 local_1a8;
  float local_1a0;
  undefined8 local_198;
  float local_190;
  undefined8 local_188;
  float local_180;
  Interval local_178;
  Float local_170;
  Float local_168;
  float fStack_164;
  float local_160;
  Interaction local_158;
  undefined8 local_108;
  undefined4 local_100;
  undefined8 local_e0;
  float local_d8;
  undefined8 local_d0;
  float local_c8;
  undefined8 local_c0;
  undefined4 local_b8;
  undefined8 local_ac;
  undefined4 local_a4;
  undefined8 local_a0;
  float local_98;
  Interval local_94;
  Float local_8c;
  undefined8 local_88;
  float local_80;
  undefined8 local_78;
  undefined4 local_70;
  undefined8 local_64;
  undefined4 local_5c;
  Float local_58;
  float fStack_54;
  float local_50;
  undefined8 local_48;
  undefined8 local_40;
  undefined8 local_38;
  undefined8 local_30;
  long local_20;
  undefined8 local_10;
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  undefined1 auVar10 [64];
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  undefined1 auVar16 [56];
  
  fVar23 = SUB84(in_RDI,0);
  time = (Float)((ulong)in_RDI >> 0x20);
  local_48 = vmovlpd_avx(in_ZMM0._0_16_);
  fVar2 = (float)in_RSI;
  uStack_3cc = (undefined4)((ulong)in_RSI >> 0x20);
  fVar24 = *(float *)(in_RSI + 0x580);
  u_00.super_Tuple2<pbrt::Point2,_float>.y = in_stack_fffffffffffffc1c;
  u_00.super_Tuple2<pbrt::Point2,_float>.x = in_stack_fffffffffffffc18;
  local_20 = in_RDX;
  local_10 = local_48;
  auVar4._0_8_ = SampleUniformDiskConcentric(u_00);
  auVar4._8_56_ = extraout_var;
  local_40 = vmovlpd_avx(auVar4._0_16_);
  t.y = in_stack_fffffffffffffbdc;
  t.x = in_stack_fffffffffffffbd8;
  local_38 = local_40;
  auVar5._0_8_ = pbrt::operator*(0.0,t);
  auVar5._8_56_ = extraout_var_00;
  local_30 = vmovlpd_avx(auVar5._0_16_);
  Point3<float>::Point3
            ((Point3<float> *)CONCAT44(in_stack_fffffffffffffbe4,in_stack_fffffffffffffbe0),
             in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8,0.0);
  local_70 = local_5c;
  local_78 = local_64;
  auVar13 = ZEXT856(0);
  PVar17.super_Tuple3<pbrt::Point3,_float>.z = fVar2;
  PVar17.super_Tuple3<pbrt::Point3,_float>.x = (float)(int)in_stack_fffffffffffffc28;
  PVar17.super_Tuple3<pbrt::Point3,_float>.y =
       (float)(int)((ulong)in_stack_fffffffffffffc28 >> 0x20);
  PVar17 = CameraBase::RenderFromCamera
                     ((CameraBase *)CONCAT44(fVar24,in_stack_fffffffffffffc10),PVar17,time);
  local_80 = PVar17.super_Tuple3<pbrt::Point3,_float>.z;
  auVar6._0_8_ = PVar17.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar6._8_56_ = auVar13;
  local_88 = vmovlpd_avx(auVar6._0_16_);
  _local_58 = local_88;
  local_50 = local_80;
  Vector3<float>::Vector3
            ((Vector3<float> *)CONCAT44(in_stack_fffffffffffffbe4,in_stack_fffffffffffffbe0),
             in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8,0.0);
  local_b8 = local_a4;
  local_c0 = local_ac;
  auVar13 = ZEXT856(0);
  VVar18.super_Tuple3<pbrt::Vector3,_float>.z = fVar2;
  VVar18.super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)in_stack_fffffffffffffc28;
  VVar18.super_Tuple3<pbrt::Vector3,_float>.y =
       (float)(int)((ulong)in_stack_fffffffffffffc28 >> 0x20);
  VVar18 = CameraBase::RenderFromCamera
                     ((CameraBase *)CONCAT44(fVar24,in_stack_fffffffffffffc10),VVar18,time);
  local_d8 = VVar18.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar7._0_8_ = VVar18.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar7._8_56_ = auVar13;
  local_e0 = vmovlpd_avx(auVar7._0_16_);
  VVar19.super_Tuple3<pbrt::Vector3,_float>.y = (float)in_stack_fffffffffffffbf0;
  VVar19.super_Tuple3<pbrt::Vector3,_float>.x = in_stack_fffffffffffffbec;
  VVar19.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_fffffffffffffbf4;
  local_d0 = local_e0;
  local_c8 = local_d8;
  local_a0 = local_e0;
  local_98 = local_d8;
  Normal3<float>::Normal3<float>((Normal3<float> *)0x8b01d7,VVar19);
  local_158.wo.super_Tuple3<pbrt::Vector3,_float>.y = local_50;
  local_158.time = local_58;
  local_158.wo.super_Tuple3<pbrt::Vector3,_float>.x = fStack_54;
  local_158.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.low =
       local_8c;
  local_158.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y = local_94;
  fVar14 = *(float *)(local_20 + 0x18);
  pIVar25 = &local_158;
  Medium::Medium((Medium *)CONCAT44(in_stack_fffffffffffffbe4,in_stack_fffffffffffffbe0),
                 (Medium *)CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8));
  local_160 = local_158.wo.super_Tuple3<pbrt::Vector3,_float>.y;
  local_168 = local_158.time;
  fStack_164 = local_158.wo.super_Tuple3<pbrt::Vector3,_float>.x;
  auVar13 = (undefined1  [56])0x0;
  local_170 = local_158.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z
              .low;
  local_178 = local_158.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y
  ;
  p_00.super_Tuple3<pbrt::Point3,_float>.z = fVar2;
  p_00.super_Tuple3<pbrt::Point3,_float>._0_8_ = &local_158.n;
  n_00.super_Tuple3<pbrt::Normal3,_float>.y = in_stack_fffffffffffffc10;
  n_00.super_Tuple3<pbrt::Normal3,_float>.x = time;
  n_00.super_Tuple3<pbrt::Normal3,_float>.z = fVar24;
  Interaction::Interaction
            ((Interaction *)CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0),p_00,n_00,
             in_stack_fffffffffffffbec,
             (Medium *)CONCAT44(in_stack_fffffffffffffbe4,in_stack_fffffffffffffbe0));
  PVar17 = Interaction::p(pIVar25);
  local_1a0 = PVar17.super_Tuple3<pbrt::Point3,_float>.z;
  auVar8._0_8_ = PVar17.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar8._8_56_ = auVar13;
  local_1a8 = vmovlpd_avx(auVar8._0_16_);
  local_198 = local_1a8;
  local_190 = local_1a0;
  PVar17 = Interaction::p(pIVar25);
  local_1d0 = PVar17.super_Tuple3<pbrt::Point3,_float>.z;
  auVar9._0_8_ = PVar17.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar9._8_56_ = auVar13;
  local_1d8 = vmovlpd_avx(auVar9._0_16_);
  auVar13 = ZEXT856(0);
  p.super_Tuple3<pbrt::Point3,_float>.z = fVar23;
  p.super_Tuple3<pbrt::Point3,_float>._0_8_ = in_RDI;
  local_1c8 = local_1d8;
  local_1c0 = local_1d0;
  local_1b8 = local_1d8;
  local_1b0 = local_1d0;
  VVar19 = Point3<float>::operator-
                     ((Point3<float> *)CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8)
                      ,p);
  local_200 = VVar19.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar10._0_8_ = VVar19.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar10._8_56_ = auVar13;
  local_208 = vmovlpd_avx(auVar10._0_16_);
  v.super_Tuple3<pbrt::Vector3,_float>.y = time;
  v.super_Tuple3<pbrt::Vector3,_float>.x = fVar23;
  v.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_fffffffffffffc10;
  local_1f8 = local_208;
  local_1f0 = local_200;
  local_1e8 = local_208;
  local_1e0 = local_200;
  local_188 = local_208;
  local_180 = local_200;
  local_1ec = Length<float>(v);
  Tuple3<pbrt::Vector3,float>::operator/=((Tuple3<pbrt::Vector3,float> *)&local_188,local_1ec);
  fVar22 = *(float *)(CONCAT44(uStack_3cc,fVar2) + 0x580);
  if ((fVar22 != 0.0) || (NAN(fVar22))) {
    fVar22 = Sqr<float>(*(float *)(CONCAT44(uStack_3cc,fVar2) + 0x580));
    fVar22 = fVar22 * 3.1415927;
  }
  else {
    fVar22 = 1.0;
  }
  local_20c = fVar22;
  fVar2 = Sqr<float>(local_1ec);
  local_218 = local_100;
  local_220 = local_108;
  local_228 = local_180;
  local_230 = local_188;
  local_238 = local_100;
  local_240 = local_108;
  local_248 = local_180;
  local_250 = local_188;
  n_01.super_Tuple3<pbrt::Normal3,_float>.z = in_stack_fffffffffffffc40;
  n_01.super_Tuple3<pbrt::Normal3,_float>.x = (float)(int)in_stack_fffffffffffffc38;
  n_01.super_Tuple3<pbrt::Normal3,_float>.y = (float)(int)((ulong)in_stack_fffffffffffffc38 >> 0x20)
  ;
  v_00.super_Tuple3<pbrt::Vector3,_float>._4_8_ = pIVar25;
  v_00.super_Tuple3<pbrt::Vector3,_float>.x = fVar14;
  tVar3 = AbsDot<float>(n_01,v_00);
  local_210 = fVar2 / (tVar3 * local_20c);
  auVar13 = ZEXT856(0);
  puVar21 = local_258;
  Point2<float>::Point2((Point2<float> *)CONCAT44(fVar2,in_stack_fffffffffffffbe0));
  VVar19 = Tuple3<pbrt::Vector3,_float>::operator-
                     ((Tuple3<pbrt::Vector3,_float> *)CONCAT44(fVar2,in_stack_fffffffffffffbe0));
  fVar14 = VVar19.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar11._0_8_ = VVar19.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar11._8_56_ = auVar13;
  pRasterOut = (Point2f *)vmovlpd_avx(auVar11._0_16_);
  auVar13 = (undefined1  [56])0x0;
  auVar16 = (undefined1  [56])0x0;
  pIVar25 = (Interaction *)&stack0xfffffffffffffd38;
  Interaction::SpawnRay(in_stack_fffffffffffffc88,(Vector3f)in_stack_fffffffffffffca0);
  SVar20 = We((PerspectiveCamera *)in_stack_fffffffffffffd40,(Ray *)in_stack_fffffffffffffd38,
              (SampledWavelengths *)CONCAT44(in_stack_fffffffffffffd34,fVar14),pRasterOut);
  auVar15._0_8_ = SVar20.values.values._8_8_;
  auVar15._8_56_ = auVar16;
  auVar12._0_8_ = SVar20.values.values._0_8_;
  auVar12._8_56_ = auVar13;
  vmovlpd_avx(auVar12._0_16_);
  vmovlpd_avx(auVar15._0_16_);
  bVar1 = SampledSpectrum::operator_cast_to_bool((SampledSpectrum *)pIVar25);
  if (bVar1) {
    pRaster_00.super_Tuple2<pbrt::Point2,_float>.y = fVar24;
    pRaster_00.super_Tuple2<pbrt::Point2,_float>.x = in_stack_fffffffffffffc10;
    CameraWiSample::CameraWiSample
              ((CameraWiSample *)CONCAT44(time,fVar23),(SampledSpectrum *)in_RDI,
               (Vector3f *)CONCAT44(fVar22,in_stack_fffffffffffffbf8),
               (Float)((ulong)puVar21 >> 0x20),pRaster_00,pIVar25,
               (Interaction *)CONCAT44(fVar2,in_stack_fffffffffffffbe0));
    pstd::optional<pbrt::CameraWiSample>::optional
              ((optional<pbrt::CameraWiSample> *)CONCAT44(fVar2,in_stack_fffffffffffffbe0),
               (CameraWiSample *)CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8));
  }
  else {
    memset(in_RDI,0,0xd0);
    pstd::optional<pbrt::CameraWiSample>::optional(in_RDI);
  }
  return (optional<pbrt::CameraWiSample> *)CONCAT44(time,fVar23);
}

Assistant:

PBRT_CPU_GPU pstd::optional<CameraWiSample> PerspectiveCamera::SampleWi(
    const Interaction &ref, Point2f u, SampledWavelengths &lambda) const {
    // Uniformly sample a lens interaction _lensIntr_
    Point2f pLens = lensRadius * SampleUniformDiskConcentric(u);
    Point3f pLensRender = RenderFromCamera(Point3f(pLens.x, pLens.y, 0), ref.time);
    Normal3f n = Normal3f(RenderFromCamera(Vector3f(0, 0, 1), ref.time));
    Interaction lensIntr(pLensRender, n, ref.time, medium);

    // Find incident direction to camera _wi_ at _ref_
    Vector3f wi = lensIntr.p() - ref.p();
    Float dist = Length(wi);
    wi /= dist;

    // Compute PDF for importance arriving at _ref_
    Float lensArea = lensRadius != 0 ? (Pi * Sqr(lensRadius)) : 1;
    Float pdf = Sqr(dist) / (AbsDot(lensIntr.n, wi) * lensArea);

    // Compute importance and return _CameraWiSample_
    Point2f pRaster;
    SampledSpectrum Wi = We(lensIntr.SpawnRay(-wi), lambda, &pRaster);
    if (!Wi)
        return {};
    return CameraWiSample(Wi, wi, pdf, pRaster, ref, lensIntr);
}